

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadStartSection(BinaryReader *this,Offset section_size)

{
  uint uVar1;
  bool bVar2;
  Result RVar3;
  Index IVar4;
  uint local_28;
  Enum local_24;
  Index func_index;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _func_index = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2d])(this->delegate_,section_size);
  bVar2 = Succeeded((Result)local_24);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    RVar3 = ReadIndex(this,&local_28,"start function index");
    bVar2 = Failed(RVar3);
    uVar1 = local_28;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      IVar4 = NumTotalFuncs(this);
      if (uVar1 < IVar4) {
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2e])();
        bVar2 = Succeeded(RVar3);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2f])();
          bVar2 = Succeeded(RVar3);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndStartSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"OnStartFunction callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"invalid start function index: %u",(ulong)local_28);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginStartSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadStartSection(Offset section_size) {
  CALLBACK(BeginStartSection, section_size);
  Index func_index;
  CHECK_RESULT(ReadIndex(&func_index, "start function index"));
  ERROR_UNLESS(func_index < NumTotalFuncs(),
               "invalid start function index: %" PRIindex, func_index);
  CALLBACK(OnStartFunction, func_index);
  CALLBACK0(EndStartSection);
  return Result::Ok;
}